

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBFunctionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer prVar1;
  SchemaCatalogEntry *pSVar2;
  pointer prVar3;
  CatalogEntry *pCVar4;
  long lVar5;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> _Var6;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var7;
  type pDVar8;
  pointer pDVar9;
  ulong uVar10;
  pointer prVar11;
  pointer prVar12;
  pointer prVar13;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  pointer prVar14;
  templated_unique_single_t result;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> local_80;
  type local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  local_50._M_head_impl = (GlobalTableFunctionState *)context;
  local_80._M_head_impl = (DuckDBFunctionsData *)operator_new(0x30);
  ((local_80._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBFunctionsData_019b35b8;
  ((local_80._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_80._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_80._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80._M_head_impl)->offset = 0;
  (local_80._M_head_impl)->offset_in_entry = 0;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar13 = local_48.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar2 = prVar13->_M_data;
      pDVar8 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                            *)&local_80);
      uStack_70 = 0;
      pcStack_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
                 ::_M_manager;
      local_78 = pDVar8;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar2,input,0x1a,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      uStack_70 = 0;
      pcStack_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
                 ::_M_manager;
      local_78 = pDVar8;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar2,input,0x19,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      uStack_70 = 0;
      pcStack_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
                 ::_M_manager;
      local_78 = pDVar8;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar2,input,0x1c,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      prVar13 = prVar13 + 1;
    } while (prVar13 !=
             local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pDVar9 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_80);
  prVar11 = (pDVar9->entries).
            super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar9 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_80);
  prVar3 = (pDVar9->entries).
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar11 != prVar3) {
    uVar10 = (long)prVar3 - (long)prVar11 >> 3;
    lVar5 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
              (prVar11,prVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)prVar3 - (long)prVar11 < 0x81) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar11,prVar3);
    }
    else {
      prVar14 = prVar11 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar11,prVar14);
      for (; prVar14 != prVar3; prVar14 = prVar14 + 1) {
        pCVar4 = prVar14->_M_data;
        prVar11 = prVar14;
        prVar12 = prVar14;
        if (pCVar4->type < (prVar14[-1]._M_data)->type) {
          do {
            prVar11 = prVar12 + -1;
            prVar1 = prVar12 + -2;
            prVar12->_M_data = prVar12[-1]._M_data;
            prVar12 = prVar11;
          } while (pCVar4->type < prVar1->_M_data->type);
        }
        prVar11->_M_data = pCVar4;
      }
    }
  }
  _Var7._M_head_impl = local_50._M_head_impl;
  _Var6._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (DuckDBFunctionsData *)0x0;
  (local_50._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var6._M_head_impl;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80._M_head_impl != (DuckDBFunctionsData *)0x0) {
    (*((local_80._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var7._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBFunctionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBFunctionsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		ExtractFunctionsFromSchema(context, schema.get(), *result);
	};

	std::sort(result->entries.begin(), result->entries.end(),
	          [&](reference<CatalogEntry> a, reference<CatalogEntry> b) {
		          return (int32_t)a.get().type < (int32_t)b.get().type;
	          });
	return std::move(result);
}